

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode store_aaaa(uchar *doh,int index,dohentry *d)

{
  dohaddr *pdVar1;
  dohaddr *a;
  dohentry *d_local;
  int index_local;
  uchar *doh_local;
  
  if (d->numaddr < 0x18) {
    pdVar1 = d->addr + d->numaddr;
    pdVar1->type = 0x1c;
    *(undefined8 *)&pdVar1->ip = *(undefined8 *)(doh + index);
    *(undefined8 *)((long)&pdVar1->ip + 8) = *(undefined8 *)(doh + (long)index + 8);
    d->numaddr = d->numaddr + 1;
  }
  return DOH_OK;
}

Assistant:

static DOHcode store_aaaa(const unsigned char *doh,
                          int index,
                          struct dohentry *d)
{
  /* silently ignore addresses over the limit */
  if(d->numaddr < DOH_MAX_ADDR) {
    struct dohaddr *a = &d->addr[d->numaddr];
    a->type = DNS_TYPE_AAAA;
    memcpy(&a->ip.v6, &doh[index], 16);
    d->numaddr++;
  }
  return DOH_OK;
}